

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O3

Clause * __thiscall
Shell::PredicateDefinition::replacePurePredicates(PredicateDefinition *this,Clause *cl)

{
  ulong uVar1;
  Entry *pEVar2;
  ulong uVar3;
  uint local_2c;
  
  uVar1 = *(ulong *)&cl->field_0x38;
  if ((uVar1 & 0xfffff) != 0) {
    uVar3 = 0;
    do {
      local_2c = (cl->_literals[uVar3]->super_Term)._functor;
      pEVar2 = Lib::DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
                         (&this->_purePreds,&local_2c);
      if (pEVar2 != (Entry *)0x0) {
        return (Clause *)0x0;
      }
      uVar3 = uVar3 + 1;
    } while (((uint)uVar1 & 0xfffff) != uVar3);
  }
  return cl;
}

Assistant:

Clause* PredicateDefinition::replacePurePredicates(Clause* cl)
{
  unsigned clen=cl->length();
  for(unsigned i=0;i<clen;i++) {
    bool val;
    if(_purePreds.find((*cl)[i]->functor(), val)) {
      ASS_EQ((*cl)[i]->isPositive(), val);
      return 0;
    }
  }
  return cl;
}